

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utilCex.c
# Opt level: O0

Abc_Cex_t * Abc_CexMakeTriv(int nRegs,int nTruePis,int nTruePos,int iFrameOut)

{
  Abc_Cex_t *pAVar1;
  int iFrame;
  int iPo;
  Abc_Cex_t *pCex;
  int iFrameOut_local;
  int nTruePos_local;
  int nTruePis_local;
  int nRegs_local;
  
  if (0 < nRegs) {
    pAVar1 = Abc_CexAlloc(nRegs,nTruePis,iFrameOut / nTruePos + 1);
    pAVar1->iPo = iFrameOut % nTruePos;
    pAVar1->iFrame = iFrameOut / nTruePos;
    return pAVar1;
  }
  __assert_fail("nRegs > 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/utilCex.c"
                ,0x59,"Abc_Cex_t *Abc_CexMakeTriv(int, int, int, int)");
}

Assistant:

Abc_Cex_t * Abc_CexMakeTriv( int nRegs, int nTruePis, int nTruePos, int iFrameOut )
{
    Abc_Cex_t * pCex;
    int iPo, iFrame;
    assert( nRegs > 0 );
    iPo    = iFrameOut % nTruePos;
    iFrame = iFrameOut / nTruePos;
    // allocate the counter example
    pCex = Abc_CexAlloc( nRegs, nTruePis, iFrame + 1 );
    pCex->iPo    = iPo;
    pCex->iFrame = iFrame;
    return pCex;
}